

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugContext.cpp
# Opt level: O0

void __thiscall Js::DebugContext::Initialize(DebugContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *alloc;
  ProbeContainer *this_00;
  TrackAllocData local_38;
  DebugContext *local_10;
  DebugContext *this_local;
  
  local_10 = this;
  if (this->diagProbesContainer != (ProbeContainer *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                ,0x1f,"(this->diagProbesContainer == nullptr)",
                                "this->diagProbesContainer == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&Js::ProbeContainer::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
             ,0x20);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_38);
  this_00 = (ProbeContainer *)new<Memory::HeapAllocator>(0x70,alloc,0x350bd0);
  Js::ProbeContainer::ProbeContainer(this_00);
  this->diagProbesContainer = this_00;
  Js::ProbeContainer::Initialize(this->diagProbesContainer,this->scriptContext);
  return;
}

Assistant:

void DebugContext::Initialize()
    {
        Assert(this->diagProbesContainer == nullptr);
        this->diagProbesContainer = HeapNew(ProbeContainer);
        this->diagProbesContainer->Initialize(this->scriptContext);
    }